

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O1

int NCONF_load_bio(CONF *conf,BIO *bp,long *eline)

{
  byte bVar1;
  char *pcVar2;
  char **ppcVar3;
  lhash_st_CONF_VALUE *section_00;
  int iVar4;
  BUF_MEM *str;
  CONF_SECTION *pCVar5;
  undefined4 extraout_var;
  size_t sVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  byte *from;
  byte *pbVar8;
  char *pcVar9;
  size_t sVar10;
  CONF_VALUE *pCVar11;
  byte *pbVar12;
  CONF_VALUE *pCVar13;
  CONF_VALUE *pCVar14;
  long lVar15;
  char **pto;
  char **ppcVar16;
  CONF_VALUE *pCVar17;
  byte *section_01;
  uint uVar18;
  uint uVar19;
  byte bVar20;
  int iVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  char *section;
  long local_80;
  CONF local_70;
  uint local_5c;
  CONF_VALUE *local_58;
  undefined8 uStack_50;
  CONF_SECTION *local_40;
  BIO *local_38;
  
  local_70.values = (lhash_st_CONF_VALUE *)0x0;
  local_38 = bp;
  str = BUF_MEM_new();
  if (str == (BUF_MEM *)0x0) {
    iVar4 = 7;
    iVar21 = 0x17f;
LAB_00474bb1:
    ERR_put_error(0xd,0,iVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                  ,iVar21);
  }
  else {
    local_70.values = (lhash_st_CONF_VALUE *)OPENSSL_strdup("default");
    if ((CONF_VALUE *)local_70.values != (CONF_VALUE *)0x0) {
      pCVar5 = NCONF_new_section((CONF *)conf,(char *)local_70.values);
      if (pCVar5 != (CONF_SECTION *)0x0) {
        local_80 = 0;
        local_70.sections = (lhash_st_CONF_SECTION *)conf;
        local_40 = pCVar5;
LAB_00474630:
        iVar4 = BUF_MEM_grow(str,0x200);
        if (CONCAT44(extraout_var,iVar4) != 0) {
          lVar22 = 0;
          bVar24 = false;
          uVar19 = 0;
LAB_0047464e:
          pcVar2 = str->data;
          pcVar9 = pcVar2 + lVar22;
          pcVar2[lVar22] = '\0';
          local_5c = uVar19;
          BIO_gets(local_38,pcVar9,0x1ff);
          pcVar2[lVar22 + 0x1ff] = '\0';
          sVar6 = strlen(pcVar9);
          uVar19 = (uint)sVar6;
          if ((bVar24) || (uVar19 != 0)) {
            uVar7 = sVar6 & 0xffffffff;
            if (0 < (int)uVar19) {
              uVar7 = (ulong)(uVar19 & 0x7fffffff);
              do {
                if ((pcVar9[uVar7 - 1] != '\r') && (pcVar9[uVar7 - 1] != '\n')) goto LAB_004746bd;
                bVar24 = 1 < (long)uVar7;
                uVar7 = uVar7 - 1;
              } while (bVar24);
              uVar7 = 0;
            }
LAB_004746bd:
            uVar18 = (uint)uVar7;
            bVar24 = uVar19 != 0 && uVar18 == uVar19;
            if (uVar19 == 0 || uVar18 != uVar19) {
              pcVar9[(int)uVar18] = '\0';
              local_80 = local_80 + 1;
            }
            uVar19 = uVar18 + local_5c;
            if (((uVar19 != 0 && SCARRY4(uVar18,local_5c) == (int)uVar19 < 0) &&
                (str->data[(ulong)uVar19 - 1] == '\\')) &&
               ((uVar19 == 1 || (str->data[(ulong)uVar19 - 2] != '\\')))) {
              uVar19 = uVar19 - 1;
              bVar24 = true;
            }
            if (!bVar24) {
              pCVar13 = (CONF_VALUE *)str->data;
              pCVar17 = pCVar13;
              while (((ulong)*(byte *)&pCVar17->section < 0x21 &&
                     ((0x100002600U >> ((ulong)*(byte *)&pCVar17->section & 0x3f) & 1) != 0))) {
                pCVar17 = (CONF_VALUE *)((long)&pCVar17->section + 1);
              }
LAB_004747dc:
              bVar1 = *(byte *)&pCVar17->section;
              if (0x26 < bVar1) {
                if (bVar1 == 0x27) goto LAB_0047476c;
                if (bVar1 != 0x5c) {
                  if (bVar1 != 0x60) goto LAB_004747c7;
                  goto LAB_0047476c;
                }
                ppcVar16 = &pCVar17->section;
                ppcVar3 = &pCVar17->section;
                pCVar17 = (CONF_VALUE *)((long)&pCVar17->section + 2);
                if (*(byte *)((long)ppcVar3 + 1) == 0) {
                  pCVar17 = (CONF_VALUE *)((long)ppcVar16 + 1);
                }
                goto LAB_004747dc;
              }
              if (bVar1 == 0x22) {
LAB_0047476c:
                pCVar14 = (CONF_VALUE *)((long)&pCVar17->section + 1);
                bVar20 = *(byte *)((long)&pCVar17->section + 1);
                bVar23 = bVar20 == bVar1;
                pCVar11 = pCVar17;
                if (bVar20 != 0 && !bVar23) {
                  do {
                    pCVar17 = pCVar14;
                    if ((bVar20 == 0x5c) &&
                       (pCVar17 = (CONF_VALUE *)((long)&pCVar11->section + 2),
                       *(byte *)((long)&pCVar11->section + 2) == 0)) goto LAB_004747dc;
                    pCVar14 = (CONF_VALUE *)((long)&pCVar17->section + 1);
                    bVar20 = *(byte *)((long)&pCVar17->section + 1);
                    bVar23 = bVar20 == bVar1;
                  } while ((bVar20 != 0) && (pCVar11 = pCVar17, bVar20 != bVar1));
                }
                pCVar17 = (CONF_VALUE *)((long)&pCVar17->section + 2);
                if (!bVar23) {
                  pCVar17 = pCVar14;
                }
                goto LAB_004747dc;
              }
              pCVar14 = pCVar13;
              if (bVar1 == 0) goto LAB_00474803;
              if (bVar1 != 0x23) {
LAB_004747c7:
                pCVar17 = (CONF_VALUE *)((long)&pCVar17->section + 1);
                goto LAB_004747dc;
              }
              *(byte *)&pCVar17->section = 0;
LAB_00474803:
              do {
                pCVar14 = (CONF_VALUE *)((long)&pCVar14->section + 1);
                uVar7 = (ulong)*(byte *)&pCVar13->section;
                if (0x20 < uVar7) goto LAB_0047482e;
                if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
                  if (uVar7 == 0) {
                    uVar19 = 0;
                    pCVar17 = (CONF_VALUE *)0x0;
                    goto LAB_00474715;
                  }
                  goto LAB_0047482e;
                }
                pCVar13 = (CONF_VALUE *)((long)&pCVar13->section + 1);
              } while( true );
            }
            pCVar17 = (CONF_VALUE *)0x0;
            goto LAB_00474715;
          }
          BUF_MEM_free(str);
          OPENSSL_free(local_70.values);
          eline = (long *)0x1;
          goto LAB_00474bef;
        }
        pCVar17 = (CONF_VALUE *)0x0;
LAB_00474c3b:
        iVar4 = 7;
        iVar21 = 0x192;
LAB_00474c54:
        ERR_put_error(0xd,0,iVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                      ,iVar21);
        goto LAB_00474bb9;
      }
      iVar4 = 0x68;
      iVar21 = 0x18a;
      goto LAB_00474bb1;
    }
  }
  local_80 = 0;
  pCVar17 = (CONF_VALUE *)0x0;
  goto LAB_00474bb9;
LAB_0047482e:
  if (*(byte *)&pCVar13->section == 0x5b) goto LAB_00474a5f;
  from = (byte *)eat_name((char *)pCVar13);
  if ((*from == 0x3a) && (from[1] == 0x3a)) {
    *from = 0;
    pCVar17 = (CONF_VALUE *)(from + 2);
    from = (byte *)eat_name((char *)pCVar17);
    pbVar12 = from;
    pCVar14 = pCVar13;
    pCVar13 = pCVar17;
    pbVar8 = from;
  }
  else {
    pCVar14 = (CONF_VALUE *)0x0;
    pbVar12 = from;
    pbVar8 = from;
  }
  while( true ) {
    section_01 = pbVar12 + 1;
    uVar7 = (ulong)*pbVar12;
    if (0x3d < uVar7) goto LAB_00474c00;
    if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
    from = from + 1;
    pbVar12 = section_01;
  }
  if (uVar7 != 0x3d) {
LAB_00474c00:
    pCVar17 = (CONF_VALUE *)0x0;
    iVar4 = 0x66;
    iVar21 = 499;
    goto LAB_00474c54;
  }
  *pbVar8 = 0;
  lVar22 = 2;
  while (((ulong)*section_01 < 0x21 && ((0x100002600U >> ((ulong)*section_01 & 0x3f) & 1) != 0))) {
    section_01 = section_01 + 1;
    lVar22 = lVar22 + 1;
  }
  do {
    pbVar12 = from;
    lVar22 = lVar22 + -1;
    from = pbVar12 + 1;
  } while (pbVar12[1] != 0);
  if (lVar22 != 0) {
    lVar15 = 0;
    do {
      if ((0x20 < (ulong)pbVar12[lVar15]) ||
         ((0x100002600U >> ((ulong)pbVar12[lVar15] & 0x3f) & 1) == 0)) break;
      lVar15 = lVar15 + -1;
    } while (lVar22 != lVar15);
    from = from + lVar15;
  }
  *from = 0;
  pCVar17 = (CONF_VALUE *)OPENSSL_zalloc(0x18);
  if (pCVar17 == (CONF_VALUE *)0x0) {
    pCVar17 = (CONF_VALUE *)0x0;
    goto LAB_00474bb9;
  }
  if (pCVar14 == (CONF_VALUE *)0x0) {
    pCVar14 = (CONF_VALUE *)local_70.values;
  }
  pcVar9 = OPENSSL_strdup((char *)pCVar13);
  pCVar17->name = pcVar9;
  if ((pcVar9 == (char *)0x0) ||
     (iVar4 = str_copy((CONF *)&pCVar17->value,(char *)section_01,pto,(char *)from), iVar4 == 0))
  goto LAB_00474bb9;
  iVar4 = strcmp((char *)pCVar14,(char *)local_70.values);
  pCVar5 = local_40;
  if (iVar4 != 0) {
    uStack_50 = 0;
    local_58 = pCVar14;
    pCVar5 = (CONF_SECTION *)
             OPENSSL_lh_retrieve(*(_LHASH **)((long)local_70.sections + 8),&local_58,
                                 lh_CONF_SECTION_call_hash_func,lh_CONF_SECTION_call_cmp_func);
    if (pCVar5 == (CONF_SECTION *)0x0) {
      pCVar5 = NCONF_new_section((CONF *)local_70.sections,(char *)pCVar14);
    }
    if (pCVar5 == (CONF_SECTION *)0x0) {
      bVar23 = false;
      ERR_put_error(0xd,0,0x68,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                    ,0x217);
      goto LAB_00474a48;
    }
  }
  pcVar9 = OPENSSL_strdup(pCVar5->name);
  pCVar17->section = pcVar9;
  bVar23 = true;
  if ((pcVar9 != (char *)0x0) &&
     (sVar10 = OPENSSL_sk_push((OPENSSL_STACK *)pCVar5->values,pCVar17), sVar10 != 0)) {
    local_58 = (CONF_VALUE *)0x0;
    iVar4 = OPENSSL_lh_insert((_LHASH *)*(CONF_METHOD **)&(local_70.sections)->field_0x0,&local_58,
                              pCVar17,lh_CONF_VALUE_call_hash_func,lh_CONF_VALUE_call_cmp_func);
    pCVar13 = local_58;
    if (iVar4 == 0) {
      OPENSSL_sk_pop((OPENSSL_STACK *)pCVar5->values);
    }
    else {
      if (local_58 != (CONF_VALUE *)0x0) {
        OPENSSL_sk_delete_ptr((OPENSSL_STACK *)pCVar5->values,local_58);
        value_free(pCVar13);
      }
      bVar23 = false;
    }
  }
  if (!bVar23) {
    pCVar17 = (CONF_VALUE *)0x0;
  }
  bVar23 = (bool)(bVar23 ^ 1);
LAB_00474a48:
  uVar19 = 0;
  if (!bVar23) goto LAB_00474bb9;
LAB_00474715:
  lVar22 = (long)(int)uVar19;
  iVar4 = BUF_MEM_grow(str,lVar22 + 0x200);
  if (CONCAT44(extraout_var_00,iVar4) == 0) goto LAB_00474c3b;
  goto LAB_0047464e;
LAB_00474a5f:
  while ((pCVar17 = pCVar14, (ulong)*(byte *)&pCVar14->section < 0x21 &&
         ((0x100002600U >> ((ulong)*(byte *)&pCVar14->section & 0x3f) & 1) != 0))) {
    pCVar14 = (CONF_VALUE *)((long)&pCVar14->section + 1);
  }
  do {
    pCVar11 = (CONF_VALUE *)eat_name((char *)pCVar17);
    pCVar13 = pCVar11;
    while( true ) {
      ppcVar16 = (char **)(ulong)*(byte *)&pCVar13->section;
      if (&DAT_00000020 < ppcVar16) break;
      if ((0x100002600U >> ((ulong)ppcVar16 & 0x3f) & 1) == 0) {
        if (ppcVar16 == (char **)0x0) goto LAB_00474aa2;
        break;
      }
      pCVar13 = (CONF_VALUE *)((long)&pCVar13->section + 1);
    }
    if (*(byte *)&pCVar13->section == 0x5d) {
      *(byte *)&pCVar11->section = 0;
      iVar4 = str_copy(&local_70,(char *)pCVar14,ppcVar16,(char *)pCVar13);
      section_00 = local_70.values;
      iVar21 = 2;
      if (iVar4 == 0) goto LAB_00474b34;
      uStack_50 = 0;
      local_58 = (CONF_VALUE *)local_70.values;
      pCVar5 = (CONF_SECTION *)
               OPENSSL_lh_retrieve(*(_LHASH **)((long)local_70.sections + 8),&local_58,
                                   lh_CONF_SECTION_call_hash_func,lh_CONF_SECTION_call_cmp_func);
      if (pCVar5 == (CONF_SECTION *)0x0) {
        pCVar5 = NCONF_new_section((CONF *)local_70.sections,(char *)section_00);
      }
      iVar21 = 4;
      local_40 = pCVar5;
      if (pCVar5 != (CONF_SECTION *)0x0) goto LAB_00474b34;
      ERR_put_error(0xd,0,0x68,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                    ,0x1e2);
      local_40 = (CONF_SECTION *)0x0;
      goto LAB_00474ac0;
    }
    bVar24 = pCVar13 != pCVar17;
    pCVar17 = pCVar13;
  } while (bVar24);
LAB_00474aa2:
  ERR_put_error(0xd,0,0x65,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                ,0x1d7);
LAB_00474ac0:
  iVar21 = 2;
LAB_00474b34:
  if (iVar21 != 4) goto LAB_00474c68;
  goto LAB_00474630;
LAB_00474c68:
  if (iVar21 != 2) goto LAB_00474bef;
  pCVar17 = (CONF_VALUE *)0x0;
LAB_00474bb9:
  BUF_MEM_free(str);
  OPENSSL_free(local_70.values);
  if (eline != (long *)0x0) {
    *eline = local_80;
  }
  eline = (long *)0x0;
  ERR_add_error_dataf("line %ld",local_80);
  value_free(pCVar17);
LAB_00474bef:
  return (int)eline;
}

Assistant:

int NCONF_load_bio(CONF *conf, BIO *in, long *out_error_line) {
  static const size_t CONFBUFSIZE = 512;
  int bufnum = 0, i, ii;
  BUF_MEM *buff = NULL;
  char *s, *p, *end;
  int again;
  long eline = 0;
  CONF_VALUE *v = NULL;
  CONF_SECTION *sv = NULL;
  char *section = NULL, *buf;
  char *start, *psection, *pname;

  if ((buff = BUF_MEM_new()) == NULL) {
    OPENSSL_PUT_ERROR(CONF, ERR_R_BUF_LIB);
    goto err;
  }

  section = OPENSSL_strdup(kDefaultSectionName);
  if (section == NULL) {
    goto err;
  }

  sv = NCONF_new_section(conf, section);
  if (sv == NULL) {
    OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
    goto err;
  }

  bufnum = 0;
  again = 0;
  for (;;) {
    if (!BUF_MEM_grow(buff, bufnum + CONFBUFSIZE)) {
      OPENSSL_PUT_ERROR(CONF, ERR_R_BUF_LIB);
      goto err;
    }
    p = &(buff->data[bufnum]);
    *p = '\0';
    BIO_gets(in, p, CONFBUFSIZE - 1);
    p[CONFBUFSIZE - 1] = '\0';
    ii = i = strlen(p);
    if (i == 0 && !again) {
      break;
    }
    again = 0;
    while (i > 0) {
      if ((p[i - 1] != '\r') && (p[i - 1] != '\n')) {
        break;
      } else {
        i--;
      }
    }
    // we removed some trailing stuff so there is a new
    // line on the end.
    if (ii && i == ii) {
      again = 1;  // long line
    } else {
      p[i] = '\0';
      eline++;  // another input line
    }

    // we now have a line with trailing \r\n removed

    // i is the number of bytes
    bufnum += i;

    v = NULL;
    // check for line continuation
    if (bufnum >= 1) {
      // If we have bytes and the last char '\\' and
      // second last char is not '\\'
      p = &(buff->data[bufnum - 1]);
      if (is_esc(p[0]) && ((bufnum <= 1) || !is_esc(p[-1]))) {
        bufnum--;
        again = 1;
      }
    }
    if (again) {
      continue;
    }
    bufnum = 0;
    buf = buff->data;

    clear_comments(buf);
    s = eat_ws(buf);
    if (*s == '\0') {
      continue;  // blank line
    }
    if (*s == '[') {
      char *ss;

      s++;
      start = eat_ws(s);
      ss = start;
    again:
      end = eat_name(ss);
      p = eat_ws(end);
      if (*p != ']') {
        if (*p != '\0' && ss != p) {
          ss = p;
          goto again;
        }
        OPENSSL_PUT_ERROR(CONF, CONF_R_MISSING_CLOSE_SQUARE_BRACKET);
        goto err;
      }
      *end = '\0';
      if (!str_copy(conf, NULL, &section, start)) {
        goto err;
      }
      if ((sv = get_section(conf, section)) == NULL) {
        sv = NCONF_new_section(conf, section);
      }
      if (sv == NULL) {
        OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
        goto err;
      }
      continue;
    } else {
      pname = s;
      psection = NULL;
      end = eat_name(s);
      if ((end[0] == ':') && (end[1] == ':')) {
        *end = '\0';
        end += 2;
        psection = pname;
        pname = end;
        end = eat_name(end);
      }
      p = eat_ws(end);
      if (*p != '=') {
        OPENSSL_PUT_ERROR(CONF, CONF_R_MISSING_EQUAL_SIGN);
        goto err;
      }
      *end = '\0';
      p++;
      start = eat_ws(p);
      while (*p != '\0') {
        p++;
      }
      p--;
      while (p != start && is_conf_ws(*p)) {
        p--;
      }
      p++;
      *p = '\0';

      if (!(v = CONF_VALUE_new())) {
        goto err;
      }
      if (psection == NULL) {
        psection = section;
      }
      v->name = OPENSSL_strdup(pname);
      if (v->name == NULL) {
        goto err;
      }
      if (!str_copy(conf, psection, &(v->value), start)) {
        goto err;
      }

      CONF_SECTION *tv;
      if (strcmp(psection, section) != 0) {
        if ((tv = get_section(conf, psection)) == NULL) {
          tv = NCONF_new_section(conf, psection);
        }
        if (tv == NULL) {
          OPENSSL_PUT_ERROR(CONF, CONF_R_UNABLE_TO_CREATE_NEW_SECTION);
          goto err;
        }
      } else {
        tv = sv;
      }
      if (add_string(conf, tv, v) == 0) {
        goto err;
      }
      v = NULL;
    }
  }
  BUF_MEM_free(buff);
  OPENSSL_free(section);
  return 1;

err:
  BUF_MEM_free(buff);
  OPENSSL_free(section);
  if (out_error_line != NULL) {
    *out_error_line = eline;
  }
  ERR_add_error_dataf("line %ld", eline);
  value_free(v);
  return 0;
}